

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O0

Vec2f __thiscall embree::Distribution2D::sample(Distribution2D *this,Vec2f *u)

{
  Vec2f VVar1;
  undefined8 in_RDX;
  Distribution1D *in_RSI;
  float *in_RDI;
  float fVar2;
  float fVar3;
  float sx;
  int idx;
  float sy;
  int local_90;
  int local_8c;
  Distribution1D *this_00;
  
  fVar3 = (float)((ulong)in_RDX >> 0x20);
  this_00 = in_RSI;
  fVar2 = Distribution1D::sample(in_RSI,fVar3);
  local_8c = (int)(in_RSI->PDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + -1;
  if ((int)fVar2 < local_8c) {
    local_8c = (int)fVar2;
  }
  local_90 = 0;
  if (-1 < local_8c) {
    local_90 = local_8c;
  }
  std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::operator[]
            ((vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_> *)
             &in_RSI[1].PDF.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish,(long)local_90);
  fVar3 = Distribution1D::sample(this_00,fVar3);
  *in_RDI = fVar3;
  in_RDI[1] = fVar2;
  VVar1.field_0.field_0.y = 0.0;
  VVar1.field_0.field_0.x = fVar2;
  return (Vec2f)VVar1.field_0;
}

Assistant:

Vec2f Distribution2D::sample(const Vec2f& u) const
  {
    /*! use u.y to sample a row */
    float sy = yDist.sample(u.y);
    int idx = clamp(int(sy),0,int(height)-1);

    /*! use u.x to sample inside the row */
    float sx = xDists[idx].sample(u.x);
    return Vec2f(sx,sy);
  }